

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

void it_note_off(IT_PLAYING *playing)

{
  IT_PLAYING *in_RDI;
  
  if (in_RDI != (IT_PLAYING *)0x0) {
    in_RDI->enabled_envelopes = in_RDI->enabled_envelopes | 1;
    in_RDI->flags = in_RDI->flags | 3;
    fix_sample_looping(in_RDI);
    it_playing_update_resamplers(in_RDI);
    if ((in_RDI->instrument != (IT_INSTRUMENT *)0x0) &&
       (((in_RDI->instrument->volume_envelope).flags & 3) != 1)) {
      in_RDI->flags = in_RDI->flags | 4;
    }
  }
  return;
}

Assistant:

static void it_note_off(IT_PLAYING *playing)
{
	if (playing) {
		playing->enabled_envelopes |= IT_ENV_VOLUME;
		playing->flags |= IT_PLAYING_BACKGROUND | IT_PLAYING_SUSTAINOFF;
		fix_sample_looping(playing);
		it_playing_update_resamplers(playing);
		if (playing->instrument)
			if ((playing->instrument->volume_envelope.flags & (IT_ENVELOPE_ON | IT_ENVELOPE_LOOP_ON)) != IT_ENVELOPE_ON)
				playing->flags |= IT_PLAYING_FADING;
	}
}